

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# camera.h
# Opt level: O3

string * __thiscall embree::Camera::str_abi_cxx11_(string *__return_storage_ptr__,Camera *this)

{
  ostream *poVar1;
  char *pcVar2;
  bool bVar3;
  stringstream stream;
  long local_1a0;
  undefined8 uStack_198;
  ostream local_190 [112];
  ios_base local_120 [264];
  
  std::__cxx11::stringstream::stringstream((stringstream *)&local_1a0);
  *(undefined8 *)((long)&uStack_198 + *(long *)(local_1a0 + -0x18)) = 10;
  std::__ostream_insert<char,std::char_traits<char>>(local_190,"--vp ",5);
  poVar1 = std::ostream::_M_insert<double>((double)(this->from).field_0.m128[0]);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1," ",1);
  poVar1 = std::ostream::_M_insert<double>((double)(this->from).field_0.m128[1]);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1," ",1);
  poVar1 = std::ostream::_M_insert<double>((double)(this->from).field_0.m128[2]);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1," ",1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"--vi ",5);
  poVar1 = std::ostream::_M_insert<double>((double)(this->to).field_0.m128[0]);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1," ",1);
  poVar1 = std::ostream::_M_insert<double>((double)(this->to).field_0.m128[1]);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1," ",1);
  poVar1 = std::ostream::_M_insert<double>((double)(this->to).field_0.m128[2]);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1," ",1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"--vu ",5);
  poVar1 = std::ostream::_M_insert<double>((double)(this->up).field_0.m128[0]);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1," ",1);
  poVar1 = std::ostream::_M_insert<double>((double)(this->up).field_0.m128[1]);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1," ",1);
  poVar1 = std::ostream::_M_insert<double>((double)(this->up).field_0.m128[2]);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1," ",1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"--fov ",6);
  poVar1 = std::ostream::_M_insert<double>((double)this->fov);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1," ",1);
  bVar3 = this->handedness == LEFT_HANDED;
  pcVar2 = "--righthanded";
  if (bVar3) {
    pcVar2 = "--lefthanded";
  }
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,pcVar2,(ulong)bVar3 ^ 0xd);
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream((stringstream *)&local_1a0);
  std::ios_base::~ios_base(local_120);
  return __return_storage_ptr__;
}

Assistant:

std::string str() const 
    {
      std::stringstream stream;
      stream.precision(10);
      stream << "--vp " << from.x    << " " << from.y    << " " << from.z    << " " 
             << "--vi " << to.x << " " << to.y << " " << to.z << " " 
             << "--vu " << up.x     << " " << up.y     << " " << up.z     << " " 
             << "--fov " << fov << " "
             << (handedness == LEFT_HANDED ? "--lefthanded" : "--righthanded");
      return stream.str();
    }